

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O0

QString * __thiscall QString::fill(QString *this,QChar ch,qsizetype size)

{
  char16_t *__first;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  char16_t *in_stack_ffffffffffffffb8;
  QString *in_stack_ffffffffffffffc0;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  resize(in_stack_ffffffffffffffc0,(qsizetype)in_stack_ffffffffffffffb8);
  if (in_RDI->size != 0) {
    __first = QArrayDataPointer<char16_t>::data(in_RDI);
    QArrayDataPointer<char16_t>::data(in_RDI);
    QChar::unicode(&local_a);
    std::fill<char16_t*,char16_t>(__first,in_stack_ffffffffffffffb8,L"䡤ҋ⠥");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QString *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString& QString::fill(QChar ch, qsizetype size)
{
    resize(size < 0 ? d.size : size);
    if (d.size)
        std::fill(d.data(), d.data() + d.size, ch.unicode());
    return *this;
}